

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprDoWhile * AnalyzeDoWhile(ExpressionContext *ctx,SynDoWhile *syntax)

{
  TypeBase *pTVar1;
  ScopeData *scopeData;
  ExprBase *pEVar2;
  int iVar3;
  ExprBase *pEVar4;
  ExprBase *pEVar5;
  undefined4 extraout_var;
  SynBase *pSVar7;
  FunctionData *onwerFunction;
  ExprDoWhile *pEVar8;
  ExpressionContext *this;
  IntrusiveList<SynBase> *pIVar9;
  IntrusiveList<ExprBase> expressions;
  ExprBase *pEVar6;
  undefined4 extraout_var_00;
  
  ExpressionContext::PushLoopScope(ctx,true,true);
  expressions.head = (ExprBase *)0x0;
  expressions.tail = (ExprBase *)0x0;
  pIVar9 = &syntax->expressions;
  while (pSVar7 = pIVar9->head, pSVar7 != (SynBase *)0x0) {
    pEVar4 = AnalyzeStatement(ctx,pSVar7);
    IntrusiveList<ExprBase>::push_back(&expressions,pEVar4);
    pIVar9 = (IntrusiveList<SynBase> *)&pSVar7->next;
  }
  pEVar4 = AnalyzeExpression(ctx,syntax->condition);
  pEVar5 = CreateConditionCast(ctx,pEVar4->source,pEVar4);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar2 = expressions.tail;
  pEVar4 = expressions.head;
  pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar3);
  pTVar1 = ctx->typeVoid;
  this = ctx;
  pSVar7 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  scopeData = ctx->scope;
  onwerFunction = ExpressionContext::GetCurrentFunction(this,scopeData);
  pSVar7 = (SynBase *)CreateBlockUpvalueClose(ctx,pSVar7,onwerFunction,scopeData);
  pEVar6->typeID = 0x36;
  pEVar6->source = &syntax->super_SynBase;
  pEVar6->type = pTVar1;
  pEVar6->next = (ExprBase *)0x0;
  pEVar6->listed = false;
  pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002410a0;
  pEVar6[1]._vptr_ExprBase = (_func_int **)pEVar4;
  *(ExprBase **)&pEVar6[1].typeID = pEVar2;
  pEVar6[1].source = pSVar7;
  ExpressionContext::PopScope(ctx,SCOPE_LOOP);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  pEVar8 = (ExprDoWhile *)CONCAT44(extraout_var_00,iVar3);
  pTVar1 = ctx->typeVoid;
  (pEVar8->super_ExprBase).typeID = 0x32;
  (pEVar8->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar8->super_ExprBase).type = pTVar1;
  (pEVar8->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar8->super_ExprBase).listed = false;
  (pEVar8->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00241340;
  pEVar8->body = pEVar6;
  pEVar8->condition = pEVar5;
  return pEVar8;
}

Assistant:

ExprDoWhile* AnalyzeDoWhile(ExpressionContext &ctx, SynDoWhile *syntax)
{
	ctx.PushLoopScope(true, true);

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	ExprBase *condition = AnalyzeExpression(ctx, syntax->condition);

	condition = CreateConditionCast(ctx, condition->source, condition);

	ExprBase *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

	ctx.PopScope(SCOPE_LOOP);

	return new (ctx.get<ExprDoWhile>()) ExprDoWhile(syntax, ctx.typeVoid, block, condition);
}